

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

void luaL_pushmodule(lua_State *L,char *modname,int sizehint)

{
  int iVar1;
  char *pcVar2;
  
  luaL_findtable(L,-0xf4628,"_LOADED",1);
  iVar1 = lua_getfield(L,-1,modname);
  if (iVar1 != 5) {
    lua_settop(L,-2);
    lua_rawgeti(L,-0xf4628,2);
    pcVar2 = luaL_findtable(L,0,modname,sizehint);
    if (pcVar2 != (char *)0x0) {
      luaL_error(L,"name conflict for module \'%s\'",modname);
    }
    lua_pushvalue(L,-1);
    lua_setfield(L,-3,modname);
  }
  lua_rotate(L,-2,-1);
  lua_settop(L,-2);
  return;
}

Assistant:

LUALIB_API void luaL_pushmodule (lua_State *L, const char *modname,
                                 int sizehint) {
  luaL_findtable(L, LUA_REGISTRYINDEX, LUA_LOADED_TABLE, 1);
  if (lua_getfield(L, -1, modname) != LUA_TTABLE) {  /* no LOADED[modname]? */
    lua_pop(L, 1);  /* remove previous result */
    /* try global variable (and create one if it does not exist) */
    lua_pushglobaltable(L);
    if (luaL_findtable(L, 0, modname, sizehint) != NULL)
      luaL_error(L, "name conflict for module '%s'", modname);
    lua_pushvalue(L, -1);
    lua_setfield(L, -3, modname);  /* LOADED[modname] = new table */
  }
  lua_remove(L, -2);  /* remove LOADED table */
}